

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O1

LispPTR COM_openfile(LispPTR *args)

{
  ushort uVar1;
  uint uVar2;
  LispPTR LVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  undefined4 extraout_var;
  char *pcVar8;
  size_t sVar9;
  int *piVar10;
  char cVar11;
  long lVar12;
  DLword *pDVar13;
  undefined4 uVar14;
  ulong uVar15;
  char *pcVar16;
  bool bVar17;
  char ver [16];
  stat sbuf;
  char name [255];
  char host [255];
  char file [4096];
  char dir [4096];
  char lfname [4101];
  char local_32d8 [16];
  stat local_32c8;
  char local_3238 [256];
  undefined4 local_3138;
  char local_3134;
  char local_3038 [4096];
  char local_2038 [4096];
  char local_1038 [4104];
  
  iVar4 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar4 != 0) {
    *Lisp_errno = 100;
    return 0;
  }
  uVar6 = args[5];
  if ((uVar6 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar6);
  }
  Lisp_errno = (int *)(Lisp_world + uVar6);
  uVar6 = *args;
  if ((uVar6 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar6);
  }
  if ((char)Lisp_world[(ulong)uVar6 + 3] == 'D') {
    lVar7 = (long)*(int *)(Lisp_world + (ulong)uVar6 + 4) * 2;
    lVar12 = 5;
  }
  else if ((char)Lisp_world[(ulong)uVar6 + 3] == 'C') {
    lVar7 = (long)*(int *)(Lisp_world + (ulong)uVar6 + 4);
    lVar12 = 3;
  }
  else {
    iVar4 = error("LispStringLength: Not a character array.\n");
    lVar7 = CONCAT44(extraout_var,iVar4);
    lVar12 = 5;
  }
  if (0x1005 < (ulong)(lVar7 + lVar12)) {
    *Lisp_errno = 200;
    return 0;
  }
  uVar6 = *args;
  if ((uVar6 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar6);
  }
  iVar4 = *(int *)(Lisp_world + (ulong)uVar6 + 4);
  iVar5 = 0x1000;
  if (iVar4 < 0x1000) {
    iVar5 = iVar4;
  }
  lVar7 = (long)iVar5;
  if ((char)Lisp_world[(ulong)uVar6 + 3] == 'D') {
    if (iVar4 == 0) {
      pcVar16 = local_1038;
    }
    else {
      lVar7 = lVar7 + (ulong)(lVar7 == 0);
      pDVar13 = Lisp_world +
                (ulong)Lisp_world[(ulong)uVar6 + 2] +
                (ulong)(*(uint *)(Lisp_world + uVar6) & 0xfffffff);
      pcVar16 = local_1038;
      do {
        *pcVar16 = *(char *)((ulong)pDVar13 ^ 2);
        pcVar16 = pcVar16 + 1;
        pDVar13 = pDVar13 + 1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    *pcVar16 = '\0';
  }
  else if ((char)Lisp_world[(ulong)uVar6 + 3] == 'C') {
    if (iVar4 != 0) {
      uVar2 = *(uint *)(Lisp_world + uVar6);
      uVar1 = Lisp_world[(ulong)uVar6 + 2];
      lVar12 = 0;
      do {
        local_1038[lVar12] =
             *(char *)((long)Lisp_world + lVar12 + (ulong)uVar1 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3
                      );
        lVar12 = lVar12 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar12);
    }
    local_1038[lVar7] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  pcVar16 = (char *)&local_3138;
  separate_host(local_1038,pcVar16);
  if ((char)local_3138 != '\0') {
    pcVar8 = (char *)((long)&local_3138 + 1);
    cVar11 = (char)local_3138;
    do {
      if ((byte)(cVar11 + 0x9fU) < 0x1a) {
        pcVar8[-1] = cVar11 + -0x20;
      }
      cVar11 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar11 != '\0');
  }
  iVar4 = 1;
  bVar17 = local_3138 == 0x4b5344;
  if ((!bVar17) && (iVar4 = 0, local_3134 != '\0' || local_3138 != 0x58494e55)) {
    return 0;
  }
  unixpathname(local_1038,local_3038,iVar4,0);
  LVar3 = args[1];
  if (1 < LVar3 - 0xe0002) {
    if (1 < LVar3 - 0xe0000) {
      return 0;
    }
    LVar3 = args[2];
    if ((LVar3 == 0xe0003) || (LVar3 == 0xe0002)) {
      pcVar16 = (char *)0x2;
    }
    else {
      bVar17 = false;
      pcVar16 = (char *)0x0;
      if (LVar3 != 0xe0001) goto LAB_001198bf;
      pcVar16 = (char *)0x202;
    }
    bVar17 = false;
    goto LAB_001198bf;
  }
  switch(args[2]) {
  case 0xe0000:
    pcVar16 = (char *)0x0;
    bVar17 = false;
    if (LVar3 == 0xe0002) {
      return 0;
    }
    break;
  case 0xe0001:
    unpack_filename(local_3038,local_2038,local_3238,local_32d8,1);
    iVar4 = make_directory(local_2038);
    pcVar16 = (char *)0x242;
    goto LAB_001198ae;
  case 0xe0002:
  case 0xe0003:
    unpack_filename(local_3038,local_2038,local_3238,local_32d8,1);
    iVar4 = make_directory(local_2038);
    pcVar16 = (char *)0x42;
LAB_001198ae:
    if (iVar4 == 0) {
      return 0;
    }
    break;
  default:
    bVar17 = false;
  }
LAB_001198bf:
  if (local_3138 == 0x4b5344) {
    iVar4 = unpack_filename(local_3038,local_2038,local_3238,local_32d8,1);
    if (iVar4 == 0) {
      return 0;
    }
    iVar4 = true_name(local_2038);
    if (iVar4 != -1) {
      return 0;
    }
    iVar4 = get_version_array(local_2038,local_3238);
    if (iVar4 == 0) {
      return 0;
    }
    strcpy(local_3038,local_3238);
    if (local_32d8[0] != '\0') {
      sVar9 = strlen(local_3038);
      (local_3038 + sVar9)[0] = '.';
      (local_3038 + sVar9)[1] = '~';
      local_3038[sVar9 + 2] = '\0';
      strcat(local_3038,local_32d8);
      sVar9 = strlen(local_3038);
      (local_3038 + sVar9)[0] = '~';
      (local_3038 + sVar9)[1] = '\0';
    }
    switch(args[1]) {
    case 0xe0000:
      iVar4 = get_old(local_2038,VA.files,local_3038,local_3238);
      break;
    case 0xe0001:
      iVar4 = get_oldest(local_2038,VA.files,local_3038,local_3238);
      break;
    case 0xe0002:
      iVar4 = get_new(local_2038,VA.files,local_3038,local_3238);
      break;
    case 0xe0003:
      iVar4 = get_old_new(local_2038,VA.files,local_3038,local_3238);
      break;
    default:
      goto switchD_001199b4_default;
    }
    if (iVar4 == 0) {
      return 0;
    }
    alarm(TIMEOUT_TIME);
    piVar10 = __errno_location();
    do {
      *piVar10 = 0;
      iVar4 = stat(local_3038,&local_32c8);
      if (iVar4 != -1) break;
    } while (*piVar10 == 4);
    alarm(0);
    if (iVar4 == 0) {
      if ((local_32c8.st_mode & 0xf000) != 0x8000) {
        *Lisp_errno = 0x17;
        return 0;
      }
    }
    else if (!(bool)(bVar17 & *piVar10 == 2)) {
      *Lisp_errno = *piVar10;
      return 0;
    }
  }
  bVar17 = (bool)(local_3138 == 0x4b5344 & bVar17);
  if (!bVar17) {
LAB_00119bc5:
    alarm(TIMEOUT_TIME);
    piVar10 = __errno_location();
LAB_00119bed:
    *piVar10 = 0;
    uVar6 = open(local_3038,(int)pcVar16,0x1b6);
    if (uVar6 == 0xffffffff) goto code_r0x00119c08;
    alarm(0);
    if ((bVar17) && (iVar4 = maintain_version(local_3038,0), iVar4 == 0)) {
      alarm(TIMEOUT_TIME);
      goto LAB_00119d86;
    }
    alarm(TIMEOUT_TIME);
    do {
      *piVar10 = 0;
      iVar4 = fstat(uVar6,&local_32c8);
      if (iVar4 != -1) {
        alarm(0);
        uVar2 = args[3];
        if ((uVar2 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
        }
        *(int *)(Lisp_world + uVar2) = (int)local_32c8.st_mtim.tv_sec + 0x1c94b00;
        uVar2 = args[4];
        if ((uVar2 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
        }
        if ((local_3138 == 0x4b5344) ||
           (uVar14 = 0xffffffff, (local_32c8.st_mode & 0xf000) == 0x4000)) {
          uVar14 = (undefined4)local_32c8.st_size;
        }
        *(undefined4 *)(Lisp_world + uVar2) = uVar14;
        if ((int)uVar6 < 0) {
          if (-0x10001 < (int)uVar6) {
            return uVar6 & 0xffff | 0xf0000;
          }
        }
        else if (uVar6 < 0x10000) {
          return uVar6 | 0xe0000;
        }
        error("Not Smallp data");
        return 0xe0000;
      }
    } while (*piVar10 == 4);
    alarm(0);
    alarm(TIMEOUT_TIME);
    do {
      *piVar10 = 0;
      iVar4 = close(uVar6);
      if (iVar4 != -1) break;
    } while (*piVar10 == 4);
    alarm(0);
    iVar4 = *piVar10;
    goto LAB_00119dab;
  }
  alarm(TIMEOUT_TIME);
  piVar10 = __errno_location();
  do {
    *piVar10 = 0;
    iVar4 = access(local_3038,0);
    if (iVar4 != -1) {
      alarm(0);
      goto LAB_00119bc5;
    }
  } while (*piVar10 == 4);
  alarm(0);
  iVar4 = *piVar10;
  if (iVar4 == 2) {
    iVar4 = maintain_version(local_3038,1);
    if (iVar4 == 0) {
      uVar15 = (ulong)TIMEOUT_TIME;
      alarm(TIMEOUT_TIME);
      do {
        *piVar10 = 0;
        iVar4 = close((int)uVar15);
        if (iVar4 != -1) break;
      } while (*piVar10 == 4);
      alarm(0);
      *Lisp_errno = *piVar10;
      return 0;
    }
    goto LAB_00119bc5;
  }
  goto LAB_00119dab;
code_r0x00119c08:
  if (*piVar10 != 4) goto code_r0x00119c0d;
  goto LAB_00119bed;
code_r0x00119c0d:
  alarm(0);
  iVar4 = *piVar10;
  goto LAB_00119dab;
  while (*piVar10 == 4) {
LAB_00119d86:
    *piVar10 = 0;
    iVar4 = close(uVar6);
    if (iVar4 != -1) break;
  }
  alarm(0);
  iVar4 = *piVar10;
LAB_00119dab:
  *Lisp_errno = iVar4;
switchD_001199b4_default:
  return 0;
}

Assistant:

LispPTR COM_openfile(LispPTR *args)
{
  char lfname[MAXPATHLEN + 5], file[MAXPATHLEN], host[MAXNAMLEN];
  char dir[MAXPATHLEN], name[MAXNAMLEN], ver[VERSIONLEN];
  int fatp, dskp, rval, fd, link_check_flg, flags, *bufp;
  size_t slen;
  struct stat sbuf;
#ifdef DOS
  char drive[1]; /* Drive designator */
  int extlen;    /* length of the raw file extension */
  char rawname[MAXNAMLEN];
#endif /* DOS */
  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[5]);

  LispStringLength(args[0], slen, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  slen = fatp ? slen + 4 + 1 : slen + 2 + 1;
  /* Add five for the host name field in Lisp format. */
  if (slen > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);

#ifdef DOS
  separate_host(lfname, host, drive);
#else
  separate_host(lfname, host);
#endif /* DOS */
  UPCASE(host);

  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

/*
 * Convert a Lisp file name to UNIX one.  If host is DSK, we also have to
 * convert a version field.
 */
#ifdef DOS
  unixpathname(lfname, file, dskp, 0, drive, &extlen, rawname);
#else
  unixpathname(lfname, file, dskp, 0);
#endif

  /*
   * Set up the flags argument for open system call.
   * And we have to handle the non existing directory case if the device is
   * DSK.
   * link_check_flg is used to determine whether we have to check a hard-link
   * based version control after opening a file.
   */
  link_check_flg = 0;
  switch (args[1]) {
    case RECOG_OLD:
    case RECOG_OLDEST:
      switch (args[2]) {
        case ACCESS_INPUT: flags = O_RDONLY; break;

        case ACCESS_OUTPUT:
          /*
           * The current implementation of Lisp page mapped device requires
           * that the output stream being "readable"!
           */
          flags = O_RDWR | O_TRUNC;
          break;

        case ACCESS_BOTH: flags = O_RDWR; break;

        case ACCESS_APPEND:
          /*
           * Should be O_WRONLY | O_APPEND.  But Lisp needs it.
           */
          flags = O_RDWR;
          break;
      }
      break;
    case RECOG_NEW:
    case RECOG_OLD_NEW:
      /*
       * In DSK device, the not existing yet file can be recognized.  In this
       * case, if there is a chance to create a new file, we have to make
       * sure that all directory to reach the recognized file exists.
       * Also we have to check the versionless file is correctly maintained
       * or not when we have a chance to create a new file.
       */
      switch (args[2]) {
        case ACCESS_INPUT:
          if (args[1] == RECOG_NEW) {
            /*
             * Opening a input stream to a new, not yet
             * existing, file does not make sense.
             */
            return (NIL);
          } else {
            /*
             * Even if OLD/NEW recognition, opening a input
             * stream never try to create a new file.  Thus,
             * without O_CREAT.
             */
            flags = O_RDONLY;
          }
          break;

        case ACCESS_OUTPUT:
          flags = O_RDWR | O_TRUNC | O_CREAT;
          unpack_filename(file, dir, name, ver, 1);
          if (make_directory(dir) == 0) return (NIL);
          if (dskp) link_check_flg = 1;
          break;

        case ACCESS_BOTH:
          flags = O_RDWR | O_CREAT;
          unpack_filename(file, dir, name, ver, 1);
          if (make_directory(dir) == 0) return (NIL);
          if (dskp) link_check_flg = 1;
          break;

        case ACCESS_APPEND:
          flags = O_RDWR | O_CREAT;
          unpack_filename(file, dir, name, ver, 1);
          if (make_directory(dir) == 0) return (NIL);
          if (dskp) link_check_flg = 1;
          break;
      }
      break;

    default: return (NIL);
  }

  /*
   * The file name which has been passed from Lisp is sometimes different
   * from the actual file name on DSK, even after the Lisp name is converted
   * to UNIX form with unixpathname.  Lisp always recognize a file on DSK
   * with version.  If the versionless file exists and it is not correctly
   * maintained, that is it is not hard linked to the existing highest
   * versioned file, Lisp regards such link missing versionless file as
   * the highest versioned file, but the actual name on the file system
   * is still versionless.
   * get_old, get_oldest, get_new, get_old_new routines handle all of the
   * complicated cases correctly and let us know the "Lisp recognizing"
   * name and "Real" name.  Both of them are UNIX format.
   * At this point, we will use one of the four routines and get the
   * real name.  We can use it to open a file which is requested from Lisp
   * with the "Lisp recognizing" name.
   */

  if (dskp) {
    if (unpack_filename(file, dir, name, ver, 1) == 0) return (NIL);
    if (true_name(dir) != -1) return (0);
    if (get_version_array(dir, name) == 0) return (NIL);
    ConcNameAndVersion(name, ver, file);

    switch (args[1]) {
      case RECOG_OLD:
        if (get_old(dir, VA.files, file, name) == 0) return (NIL);
        break;

      case RECOG_OLDEST:
        if (get_oldest(dir, VA.files, file, name) == 0) return (NIL);
        break;

      case RECOG_NEW:
        if (get_new(dir, VA.files, file, name) == 0) return (NIL);
        break;

      case RECOG_OLD_NEW:
        if (get_old_new(dir, VA.files, file, name) == 0) return (NIL);
        break;

      default: return (NIL);
    }
  }

  /*
   * DSK device only allow to open a regular file.
   */
  if (dskp) {
    TIMEOUT(rval = stat(file, &sbuf));
    if (rval == 0) {
      if (!S_ISREG(sbuf.st_mode)) {
        /*
         * The Lisp code handles this case as same as "file table
         * overflow" error.  Final error message is "File won't
         * open".
         */
        *Lisp_errno = ENFILE;
        return (NIL);
      }
    } else {
      /*
       * When stat failed, only if the reason is "file does not
       * exist" and we are trying to open a file with a mode we can
       * create a new file, we can proceed.
       */
      if (errno != ENOENT || !link_check_flg) {
        *Lisp_errno = errno;
        return (NIL);
      }
    }
  }
  if (dskp && link_check_flg) {
    /*
     * When we are opening a file with a mode we might create a new file,
     * we have to make sure that versionless file is maintained
     * correctly before we actually creating a new file, because a
     * created new file will change the status and the recognition on
     * the same file with the same recognition mode will return the
     * different result.
     * At this point, the third argument for maintain_version, forcep is
     * 1, because a lonly versionless file should be linked to version 1.
     * If we are opening a file recognized with new mode, version 2,
     * without pre-linking a versionless to version 1, the final
     * clean up maintain_version will link the versionless to version 3.
     */
    TIMEOUT(rval = access(file, F_OK));
    if (rval == -1) {
      if (errno == ENOENT) {
        /*
         * Actually we are creating a new file.  We have to
         * maintain a version status.
         */
        if (maintain_version(file, 1) == 0) {
          TIMEOUT(rval = close(fd));
          *Lisp_errno = errno;
          return (NIL);
        }
      } else {
        /*
         * Because of other reason, access call failed.
         */
        *Lisp_errno = errno;
        return (NIL);
      }
    } else {
/*
 * The subjective file has already existed.  We don't need
 * to maintain a version.
 */
#ifdef DOS
      if (args[1] == RECOG_NEW) {
        char old[MAXPATHLEN];
        make_old_version(old, file);
        unlink(old);
        rename(file, old); /* make old version */
      }
#endif /* DOS */
    }
  }

  /*
   * If a new file is created, its actual mode is computed from the
   * third argument for open and the process's umask.  I'm pretty sure
   * 0666 would be most appropriate mode to specify here.
   */
  TIMEOUT(fd = open(file, flags, 0666));
  if (fd == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

  if (dskp && link_check_flg) {
    /*
     * Again we have to maintain version to clean up the directory.
     * This time we invoke maintain_version with forcep off, because
     * the entirely newly created file, versionless file, should not
     * be linked to any file.
     */
    if (maintain_version(file, 0) == 0) {
      TIMEOUT(close(fd));
      *Lisp_errno = errno;
      return (NIL);
    }
  }

  TIMEOUT(rval = fstat(fd, &sbuf));
  if (rval == -1) {
    TIMEOUT(close(fd));
    *Lisp_errno = errno;
    return (NIL);
  }

  bufp = (int *)NativeAligned4FromLAddr(args[3]);
  *bufp = ToLispTime(sbuf.st_mtime);

  bufp = (int *)NativeAligned4FromLAddr(args[4]);
  if (!dskp && (!S_ISREG(sbuf.st_mode)) && (!S_ISDIR(sbuf.st_mode))) {
    /*
     * Not a regular file or directory file.  Put on a marker.
     */
    *bufp = SPECIALFILEMARK;
  } else {
    *bufp = sbuf.st_size;
  }

  return (GetSmallp(fd));
}